

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  uchar *puVar1;
  uint16_t *puVar2;
  short sVar3;
  uint uVar4;
  wchar_t wVar5;
  long lVar6;
  byte bVar7;
  wchar_t wVar8;
  ulong uVar9;
  long lVar10;
  htree_t *phVar11;
  uint uVar12;
  ushort uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  wchar_t wVar18;
  ulong uVar19;
  wchar_t bitptn [17];
  wchar_t weight [17];
  uint auStack_b8 [20];
  uint auStack_68 [18];
  
  uVar4 = 0x8000;
  uVar9 = 0;
  uVar19 = 0;
  uVar12 = 0;
  do {
    auStack_b8[uVar9 + 1] = uVar12;
    auStack_68[uVar9 + 1] = uVar4;
    lVar6 = uVar9 + 1;
    uVar12 = hf->freq[lVar6] * uVar4 + uVar12;
    uVar9 = uVar9 + 1;
    if (hf->freq[lVar6] != L'\0') {
      uVar19 = uVar9 & 0xffffffff;
    }
    uVar4 = uVar4 >> 1;
  } while (uVar9 != 0x10);
  wVar5 = L'\0';
  if ((uVar12 == 0x10000) && (wVar18 = (wchar_t)uVar19, wVar18 <= hf->tbl_bits)) {
    hf->max_bits = wVar18;
    if ((wVar18 < L'\x10') && (L'\0' < wVar18)) {
      bVar7 = 0x10 - (char)uVar19;
      uVar9 = 1;
      do {
        auStack_b8[uVar9] = (int)auStack_b8[uVar9] >> (bVar7 & 0x1f);
        auStack_68[uVar9] = (int)auStack_68[uVar9] >> (bVar7 & 0x1f);
        uVar9 = uVar9 + 1;
      } while ((uint)(wVar18 + L'\x01') != uVar9);
    }
    wVar5 = L'\0';
    if (L'\n' < wVar18) {
      wVar5 = wVar18 + L'\xfffffff6';
      lVar6 = 1;
      do {
        auStack_b8[lVar6] = (int)auStack_b8[lVar6] >> ((byte)wVar5 & 0x1f);
        auStack_68[lVar6] = (int)auStack_68[lVar6] >> ((byte)wVar5 & 0x1f);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xb);
      lVar6 = (long)hf->freq[10] * (long)(int)auStack_68[10] + (long)(int)auStack_b8[10];
      if ((int)lVar6 < 0x400) {
        lVar16 = 0x7fe;
        if (0x7fe < lVar6 * 2) {
          lVar16 = lVar6 * 2;
        }
        memset(hf->tbl + lVar6,0,lVar16 + lVar6 * -2 + 2);
      }
    }
    hf->shift_bits = wVar5;
    puVar1 = hf->bitlen;
    puVar2 = hf->tbl;
    wVar18 = hf->len_avail;
    lVar6 = (long)wVar18;
    hf->tree_used = L'\0';
    if (0 < lVar6) {
      uVar4 = 1 << ((byte)wVar5 - 1 & 0x1f);
      lVar16 = 0;
      do {
        bVar7 = puVar1[lVar16];
        if (bVar7 == 0) {
LAB_001775d2:
          iVar17 = 0xf;
        }
        else {
          uVar9 = (ulong)((uint)bVar7 * 4);
          uVar12 = *(uint *)((long)auStack_b8 + uVar9);
          uVar15 = *(uint *)((long)auStack_68 + uVar9);
          *(uint *)((long)auStack_b8 + uVar9) = uVar15 + uVar12;
          if (bVar7 < 0xb) {
            iVar17 = 1;
            if (0x400 < (int)(uVar15 + uVar12)) goto LAB_001775d7;
            if (0 < (int)uVar15) {
              lVar10 = (ulong)uVar15 + 1;
              do {
                puVar2[(long)(int)uVar12 + lVar10 + -2] = (uint16_t)lVar16;
                lVar10 = lVar10 + -1;
              } while (1 < lVar10);
            }
            goto LAB_001775d2;
          }
          iVar14 = (int)uVar12 >> ((byte)wVar5 & 0x1f);
          sVar3 = (short)wVar18;
          if (puVar2[iVar14] == 0) {
            wVar8 = hf->tree_used;
            puVar2[iVar14] = (short)wVar8 + sVar3;
            hf->tree_used = wVar8 + L'\x01';
            iVar17 = 1;
            if (wVar8 < hf->tree_avail) {
              phVar11 = hf->tree + wVar8;
              phVar11->left = 0;
              phVar11->right = 0;
              goto LAB_00177652;
            }
          }
          else {
            iVar17 = 1;
            wVar8 = (wchar_t)puVar2[iVar14];
            if ((wVar18 <= wVar8) && (wVar8 < hf->tree_used + wVar18)) {
              phVar11 = hf->tree + (wVar8 - wVar18);
LAB_00177652:
              uVar13 = (ushort)uVar4;
              if (bVar7 != 0xb) {
                iVar17 = bVar7 - 10;
                uVar15 = uVar4;
                do {
                  if ((uVar15 & 0xffff & uVar12) == 0) {
                    uVar13 = phVar11->right;
                    if (wVar18 <= (int)(uint)uVar13) goto LAB_001776b8;
                    wVar8 = hf->tree_used;
                    phVar11->right = (short)wVar8 + sVar3;
LAB_0017769a:
                    hf->tree_used = wVar8 + L'\x01';
                    if (hf->tree_avail <= wVar8) {
                      iVar17 = 1;
                      goto LAB_001775d7;
                    }
                    phVar11 = hf->tree + wVar8;
                    phVar11->left = 0;
                    phVar11->right = 0;
                  }
                  else {
                    uVar13 = phVar11->left;
                    if ((int)(uint)uVar13 < wVar18) {
                      wVar8 = hf->tree_used;
                      phVar11->left = (short)wVar8 + sVar3;
                      goto LAB_0017769a;
                    }
LAB_001776b8:
                    phVar11 = hf->tree + ((ulong)uVar13 - lVar6);
                  }
                  uVar15 = (uVar15 & 0xffff) >> 1;
                  iVar17 = iVar17 + -1;
                  uVar13 = (ushort)uVar15;
                } while (1 < iVar17);
              }
              if (((ushort)uVar12 & uVar13) == 0) {
                iVar17 = 1;
                if (phVar11->right == 0) {
                  phVar11 = (htree_t *)&phVar11->right;
                  goto LAB_001776fc;
                }
              }
              else {
                iVar17 = 1;
                if (phVar11->left == 0) {
LAB_001776fc:
                  phVar11->left = (uint16_t)lVar16;
                  iVar17 = 0;
                }
              }
            }
          }
        }
LAB_001775d7:
        if ((iVar17 != 0xf) && (iVar17 != 0)) {
          return L'\0';
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar6);
    }
    wVar5 = L'\x01';
  }
  return wVar5;
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		int htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			while (--cnt >= 0)
				p[cnt] = (uint16_t)i;
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}